

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutPool.cpp
# Opt level: O1

void __thiscall HighsCutPool::lpCutRemoved(HighsCutPool *this,HighsInt cut)

{
  int *piVar1;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *this_00;
  pair<std::_Rb_tree_iterator<std::pair<int,_int>_>,_std::_Rb_tree_iterator<std::pair<int,_int>_>_>
  pVar2;
  HighsInt local_24;
  key_type local_20;
  
  local_24 = cut;
  if ((this->matrix_).colsLinked.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start[cut] != '\0') {
    this_00 = &this->propRows;
    local_20 = (key_type)((ulong)(uint)cut << 0x20 | 0xffffffff);
    pVar2 = std::
            _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
            ::equal_range(&this_00->_M_t,&local_20);
    std::
    _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar2.first._M_node,(_Base_ptr)pVar2.second._M_node);
    local_20.first = 1;
    std::
    _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
    ::_M_emplace_unique<int,int&>
              ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                *)this_00,&local_20.first,&local_24);
  }
  (this->ages_).super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_start[local_24] = 1;
  this->numLpCuts = this->numLpCuts + -1;
  piVar1 = (this->ageDistribution).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

void HighsCutPool::lpCutRemoved(HighsInt cut) {
  if (matrix_.columnsLinked(cut)) {
    propRows.erase(std::make_pair(-1, cut));
    propRows.emplace(1, cut);
  }
  ages_[cut] = 1;
  --numLpCuts;
  ++ageDistribution[1];
}